

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O2

void __thiscall
cppassert::internal::BackTraceSymbol::setSymbol
          (BackTraceSymbol *this,char *backtrace,char *demangledName,char *offset)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  
  deallocate(this);
  sVar1 = strlen(backtrace);
  sVar2 = strlen(demangledName);
  sVar3 = strlen(offset);
  __dest = (char *)malloc(sVar3 + sVar1 + sVar2 + 3);
  this->allocated_ = __dest;
  if (__dest != (char *)0x0) {
    strcpy(__dest,backtrace);
    (__dest + sVar1)[0] = '(';
    (__dest + sVar1)[1] = '\0';
    strcpy(__dest + sVar1 + 1,demangledName);
    (__dest + sVar2 + 1 + sVar1)[0] = '+';
    (__dest + sVar2 + 1 + sVar1)[1] = '\0';
    strcpy(__dest + sVar2 + sVar1 + 2,offset);
    this->symbol_ = __dest;
  }
  return;
}

Assistant:

void setSymbol(const char *backtrace
                    , const char *demangledName
                    , const char *offset)
    {
        deallocate();
        std::size_t backTraceLength = std::strlen(backtrace);
        std::size_t nameLength = std::strlen(demangledName);
        std::size_t offsetLength = std::strlen(offset)+1;
        allocated_ = static_cast<char *>(
                        std::malloc(backTraceLength+nameLength+offsetLength+2));
        if(!allocated_)
        {
            return;
        }
        char *begin = allocated_;
        std::strcpy(allocated_, backtrace);
        begin += backTraceLength;
        std::strcpy(begin, "(");
        begin += 1;
        std::strcpy(begin, demangledName);
        begin += nameLength;
        std::strcpy(begin, "+");
        begin += 1;
        std::strcpy(begin, offset);
        symbol_ = allocated_;
    }